

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

int __thiscall
httplib::Stream::write_format<char_const*,char_const*>
          (Stream *this,char *fmt,char **args,char **args_1)

{
  uint uVar1;
  vector<char,_std::allocator<char>_> glowable_buf;
  array<char,_2048UL> buf;
  allocator_type local_849;
  _Vector_base<char,_std::allocator<char>_> local_848;
  char local_830 [2048];
  
  uVar1 = snprintf(local_830,0x7ff,fmt,*args,*args_1);
  if (0 < (int)uVar1) {
    if (uVar1 < 0x7ff) {
      uVar1 = (*this->_vptr_Stream[3])(this,local_830,(ulong)uVar1);
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_848,0x800,&local_849);
      while( true ) {
        if ((int)uVar1 <
            (int)((long)local_848._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_848._M_impl.super__Vector_impl_data._M_start) + -1) break;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&local_848,
                   ((long)local_848._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_848._M_impl.super__Vector_impl_data._M_start) * 2);
        uVar1 = snprintf(local_848._M_impl.super__Vector_impl_data._M_start,
                         (size_t)(local_848._M_impl.super__Vector_impl_data._M_finish +
                                 ~(ulong)local_848._M_impl.super__Vector_impl_data._M_start),fmt,
                         *args,*args_1);
      }
      uVar1 = (*this->_vptr_Stream[3])
                        (this,local_848._M_impl.super__Vector_impl_data._M_start,(long)(int)uVar1);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_848);
    }
  }
  return uVar1;
}

Assistant:

inline int Stream::write_format(const char *fmt, const Args &... args) {
  std::array<char, 2048> buf;

#if defined(_MSC_VER) && _MSC_VER < 1900
  auto n = _snprintf_s(buf, bufsiz, buf.size() - 1, fmt, args...);
#else
  auto n = snprintf(buf.data(), buf.size() - 1, fmt, args...);
#endif
  if (n <= 0) { return n; }

  if (n >= static_cast<int>(buf.size()) - 1) {
    std::vector<char> glowable_buf(buf.size());

    while (n >= static_cast<int>(glowable_buf.size() - 1)) {
      glowable_buf.resize(glowable_buf.size() * 2);
#if defined(_MSC_VER) && _MSC_VER < 1900
      n = _snprintf_s(&glowable_buf[0], glowable_buf.size(),
                      glowable_buf.size() - 1, fmt, args...);
#else
      n = snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...);
#endif
    }
    return write(&glowable_buf[0], n);
  } else {
    return write(buf.data(), n);
  }
}